

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read-demo.c
# Opt level: O1

int main(int argc,char **argv)

{
  int __fd;
  size_t __n;
  char buffer [5];
  undefined1 local_15 [5];
  
  __fd = open("file",0,0x1b6);
  __n = read(__fd,local_15,5);
  if (__n != 0) {
    do {
      write(1,local_15,__n);
      __n = read(__fd,local_15,5);
    } while (__n != 0);
  }
  close(__fd);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    int fd = open("file", O_RDONLY, 0666);
    size_t length;
    char buffer[5];
    while((length = read(fd, &buffer[0], 5)) != 0)
    {
        write(1, &buffer[0], length);
    }
    close(fd);

}